

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

Am_Wrapper * compute_list_path_proc(Am_Object *self)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  int iVar6;
  int index;
  Am_Value_List list;
  Am_Value_List new_list;
  Am_Value value2;
  Am_Value value1;
  
  value1.type = 0;
  value1.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = Am_Object::Get(self,0x181,1);
  Am_Value::operator=(&value1,pAVar4);
  value2.type = 0;
  value2.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar4 = Am_Object::Get(self,0x182,1);
  Am_Value::operator=(&value2,pAVar4);
  pAVar4 = Am_Object::Get(self,0x114,0);
  Am_Value_List::Am_Value_List(&list,pAVar4);
  Am_Value_List::Am_Value_List(&new_list);
  bVar1 = Am_Value_List::Valid(&list);
  if (bVar1) {
    iVar3 = list_position(&list,&value1);
    index = 0;
    if (iVar3 != -1) {
      index = iVar3;
    }
    iVar3 = list_position(&list,&value2);
    if (iVar3 == -1) {
      uVar2 = Am_Value_List::Length(&list);
      iVar3 = uVar2 - 1;
    }
    Am_Value_List::Start(&list);
    Am_Value_List::Move_Nth(&list,index);
    pAVar4 = Am_Value_List::Get(&list);
    Am_Object::Set(self,0x181,pAVar4,0);
    iVar6 = iVar3;
    if (iVar3 < index) {
      iVar6 = index;
    }
    for (; index < iVar3; index = index + 1) {
      pAVar4 = Am_Value_List::Get(&list);
      Am_Value_List::Add(&new_list,pAVar4,Am_TAIL,true);
      Am_Value_List::Next(&list);
    }
    for (; iVar3 < iVar6; iVar6 = iVar6 + -1) {
      pAVar4 = Am_Value_List::Get(&list);
      Am_Value_List::Add(&new_list,pAVar4,Am_TAIL,true);
      Am_Value_List::Prev(&list);
    }
    pAVar4 = Am_Value_List::Get(&list);
    Am_Value_List::Add(&new_list,pAVar4,Am_TAIL,true);
    pAVar4 = Am_Value_List::Get(&list);
    Am_Object::Set(self,0x182,pAVar4,0);
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&new_list);
  }
  else {
    pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_(&list);
  }
  Am_Value_List::~Am_Value_List(&new_list);
  Am_Value_List::~Am_Value_List(&list);
  Am_Value::~Am_Value(&value2);
  Am_Value::~Am_Value(&value1);
  return pAVar5;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Start_Do,
                 (Am_Object interp))
{
  // set up the animation timer
  Am_Time delay = interp.Get(Am_REPEAT_DELAY);
  Am_INTER_TRACE_PRINT(interp, "Animator Start of " << interp
                                                    << " delay = " << delay);
  Am_Register_Timer(delay, interp, Am_ANIMATION_METHOD, false);

  // invoke the animation method for time == 0
  Am_Timer_Method method = interp.Get(Am_ANIMATION_METHOD);
  method.Call(interp, Am_Time(static_cast<unsigned long>(0)));

  Am_Set_Animated_Slots(interp);

  return;
}